

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

char * Curl_checkProxyheaders(connectdata *conn,char *thisheader)

{
  int iVar1;
  size_t max;
  long lVar2;
  long *plVar3;
  
  max = strlen(thisheader);
  if ((((conn->bits).field_0x4 & 0x20) == 0) ||
     (lVar2 = 0x7f8, ((conn->data->set).field_0x8e8 & 0x10) == 0)) {
    lVar2 = 0x7f0;
  }
  plVar3 = *(long **)((long)conn->data->sockets + lVar2 + -0x80);
  while( true ) {
    if (plVar3 == (long *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Curl_strncasecompare((char *)*plVar3,thisheader,max);
    if ((iVar1 != 0) && ((((char *)*plVar3)[max] & 0xfeU) == 0x3a)) break;
    plVar3 = (long *)plVar3[1];
  }
  return (char *)*plVar3;
}

Assistant:

char *Curl_checkProxyheaders(const struct connectdata *conn,
                             const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);
  struct Curl_easy *data = conn->data;

  for(head = (conn->bits.proxy && data->set.sep_headers) ?
        data->set.proxyheaders : data->set.headers;
      head; head = head->next) {
    if(strncasecompare(head->data, thisheader, thislen) &&
       Curl_headersep(head->data[thislen]))
      return head->data;
  }

  return NULL;
}